

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::HeapType> * __thiscall
wasm::WATParser::ParseDefsCtx::getBlockTypeFromTypeUse
          (Result<wasm::HeapType> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,HeapType type
          )

{
  bool bVar1;
  Index pos_local;
  ParseDefsCtx *this_local;
  HeapType type_local;
  
  this_local = (ParseDefsCtx *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  bVar1 = HeapType::isSignature((HeapType *)&this_local);
  if (!bVar1) {
    __assert_fail("type.isSignature()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/contexts.h"
                  ,0x5ee,
                  "Result<HeapType> wasm::WATParser::ParseDefsCtx::getBlockTypeFromTypeUse(Index, HeapType)"
                 );
  }
  Result<wasm::HeapType>::Result<wasm::HeapType>(__return_storage_ptr__,(HeapType *)&this_local);
  return __return_storage_ptr__;
}

Assistant:

Result<HeapType> getBlockTypeFromTypeUse(Index pos, HeapType type) {
    assert(type.isSignature());
    // TODO: Error if block parameters are named
    return type;
  }